

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voc.c
# Opt level: O0

void vocadd2(voccxdef *ctx,prpnum p,objnum objn,int classflg,uchar *wrdtxt,int len,uchar *wrd2,
            int len2)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uchar *puVar4;
  size_t sVar5;
  long in_RDI;
  void *in_R8;
  uint in_R9D;
  void *in_stack_00000008;
  uint in_stack_00000010;
  uint hshval;
  uint need;
  vocdef *prv;
  vocdef *v;
  int in_stack_00000080;
  objnum in_stack_00000084;
  prpnum in_stack_00000086;
  vocdef *in_stack_00000088;
  voccxdef *in_stack_00000090;
  int in_stack_ffffffffffffffac;
  objnum objn_00;
  uchar *in_stack_ffffffffffffffb0;
  prpnum p_00;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  voccxdef *in_stack_ffffffffffffffc0;
  uchar *puVar6;
  undefined8 *puVar7;
  int in_stack_ffffffffffffffe0;
  
  if ((in_R9D != 0) || (in_stack_00000010 != 0)) {
    uVar1 = vochsh(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    for (puVar7 = *(undefined8 **)(in_RDI + 0x670 + (ulong)uVar1 * 8); puVar7 != (undefined8 *)0x0;
        puVar7 = (undefined8 *)*puVar7) {
      if (((*(byte *)(puVar7 + 1) == in_R9D) &&
          (iVar2 = memcmp(in_R8,puVar7 + 2,(long)(int)in_R9D), iVar2 == 0)) &&
         (((in_stack_00000008 == (void *)0x0 && (*(char *)((long)puVar7 + 9) == '\0')) ||
          ((*(byte *)((long)puVar7 + 9) == in_stack_00000010 &&
           (iVar2 = memcmp(in_stack_00000008,(void *)((long)puVar7 + (long)(int)in_R9D + 0x10),
                           (long)(int)in_stack_00000010), iVar2 == 0)))))) {
        vocwset(in_stack_00000090,in_stack_00000088,in_stack_00000086,in_stack_00000084,
                in_stack_00000080);
        return;
      }
    }
    puVar6 = (uchar *)0x0;
    for (puVar4 = *(uchar **)(in_RDI + 0x30);
        (puVar4 != (uchar *)0x0 && ((uint)puVar4[8] != in_R9D + in_stack_00000010));
        puVar4 = *(uchar **)puVar4) {
      puVar6 = puVar4;
    }
    objn_00 = (objnum)((ulong)in_stack_00000008 >> 0x20);
    p_00 = (prpnum)((ulong)in_stack_00000008 >> 0x30);
    if (puVar4 == (uchar *)0x0) {
      uVar3 = in_R9D + in_stack_00000010 + 0x17;
      if (*(uint *)(in_RDI + 0x54) < uVar3) {
        puVar4 = mchalo((errcxdef *)in_stack_ffffffffffffffc0,
                        CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                        (char *)in_stack_ffffffffffffffb0);
        *(uchar **)(in_RDI + 0x28) = puVar4;
        *(undefined4 *)(in_RDI + 0x54) = 0x2000;
      }
      iVar2 = (int)puVar6;
      puVar6 = *(uchar **)(in_RDI + 0x28);
      sVar5 = osrndsz((ulong)uVar3);
      *(size_t *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x28) + (sVar5 & 0xffffffff);
      if ((uint)sVar5 < *(uint *)(in_RDI + 0x54)) {
        *(uint *)(in_RDI + 0x54) = *(int *)(in_RDI + 0x54) - (uint)sVar5;
      }
      else {
        *(undefined4 *)(in_RDI + 0x54) = 0;
      }
      puVar6[0xc] = 0xff;
      puVar6[0xd] = 0xff;
      puVar6[0xe] = 0xff;
      puVar6[0xf] = 0xff;
      vocset(in_stack_ffffffffffffffc0,
             (vocdef *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_00000010),p_00,objn_00,
             (int)in_stack_00000008,(uchar *)CONCAT44(in_stack_ffffffffffffffac,in_R9D),iVar2,puVar6
             ,in_stack_ffffffffffffffe0);
    }
    else {
      if (puVar6 == (uchar *)0x0) {
        *(undefined8 *)(in_RDI + 0x30) = *(undefined8 *)puVar4;
      }
      else {
        *(undefined8 *)puVar6 = *(undefined8 *)puVar4;
      }
      puVar4[0xc] = 0xff;
      puVar4[0xd] = 0xff;
      puVar4[0xe] = 0xff;
      puVar4[0xf] = 0xff;
      vocset(in_stack_ffffffffffffffc0,
             (vocdef *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_00000010),p_00,objn_00,
             (int)in_stack_00000008,(uchar *)CONCAT44(in_stack_ffffffffffffffac,in_R9D),(int)puVar6,
             puVar4,in_stack_ffffffffffffffe0);
    }
  }
  return;
}

Assistant:

void vocadd2(voccxdef *ctx, prpnum p, objnum objn, int classflg,
             uchar *wrdtxt, int len, uchar *wrd2, int len2)
{
    vocdef  *v;
    vocdef  *prv;
    uint     need;
    uint     hshval;

    /* if the word is null, ignore it entirely */
    if (len == 0 && len2 == 0)
        return;

    /* look for a vocdef entry with the same word text */
    hshval = vochsh(wrdtxt, len);
    for (v = ctx->voccxhsh[hshval] ; v ; v = v->vocnxt)
    {
        /* if it matches on both words, use this entry */
        if (v->voclen == len && !memcmp(wrdtxt, v->voctxt, (size_t)len)
            && ((!wrd2 && v->vocln2 == 0)
                || (v->vocln2 == len2 &&
                    !memcmp(wrd2, v->voctxt + len, (size_t)len2))))
        {
            vocwset(ctx, v, p, objn, classflg);
            return;
        }
    }

    /* look for a free vocdef entry of the same size */
    for (prv = (vocdef *)0, v = ctx->voccxfre ; v ; prv = v, v = v->vocnxt)
        if (v->voclen == len + len2) break;
    
    if (v)
    {
        /* we found something - unlink from free list */
        if (prv) prv->vocnxt = v->vocnxt;
        else ctx->voccxfre = v->vocnxt;
        
        /* reuse the entry */
        v->vocwlst = VOCCXW_NONE;
        vocset(ctx, v, p, objn, classflg, wrdtxt, len, wrd2, len2);
        return;
    }
    
    /* didn't find an existing vocdef; allocate a new one */
    need = sizeof(vocdef) + len + len2 - 1;
    if (ctx->voccxrem < need)
    {
        /* not enough space in current page; allocate a new one */
        ctx->voccxpool = mchalo(ctx->voccxerr, VOCPGSIZ, "vocadd2");
        ctx->voccxrem = VOCPGSIZ;
    }
    
    /* use top of current pool, and update pool pointer and size */
    v = (vocdef *)ctx->voccxpool;
    need = osrndsz(need);
    ctx->voccxpool += need;
    if (ctx->voccxrem > need) ctx->voccxrem -= need;
    else ctx->voccxrem = 0;
    
    /* set up new vocdef */
    v->vocwlst = VOCCXW_NONE;
    vocset(ctx, v, p, objn, classflg, wrdtxt, len, wrd2, len2);
}